

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O1

Status cmsys::SystemTools::CopyADirectory(string *source,string *destination,bool always)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  Status SVar4;
  unsigned_long uVar5;
  char *pcVar6;
  undefined7 in_register_00000011;
  ulong uVar7;
  ulong dindex;
  CopyStatus CVar8;
  Directory dir;
  string fullPath;
  string fullDestPath;
  Directory local_80;
  uint local_78;
  undefined4 local_74;
  string local_70;
  string local_50;
  
  Directory::Directory(&local_80);
  SVar4 = Directory::Load(&local_80,source,(string *)0x0);
  if (SVar4.Kind_ == Success) {
    SVar4 = MakeDirectory(destination,(mode_t *)0x0);
    uVar7 = (ulong)SVar4 >> 0x20;
    if (SVar4.Kind_ == Success) {
      local_74 = (undefined4)CONCAT71(in_register_00000011,always);
      local_78 = (uint)always;
      for (dindex = 0; uVar5 = Directory::GetNumberOfFiles(&local_80), dindex < uVar5;
          dindex = dindex + 1) {
        pcVar6 = Directory::GetFile(&local_80,dindex);
        iVar3 = strcmp(pcVar6,".");
        if (iVar3 != 0) {
          pcVar6 = Directory::GetFile(&local_80,dindex);
          iVar3 = strcmp(pcVar6,"..");
          if (iVar3 != 0) {
            local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
            pcVar1 = (source->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_70,pcVar1,pcVar1 + source->_M_string_length);
            std::__cxx11::string::append((char *)&local_70);
            Directory::GetFile(&local_80,dindex);
            std::__cxx11::string::append((char *)&local_70);
            bVar2 = FileIsDirectory(&local_70);
            if (bVar2) {
              local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
              pcVar1 = (destination->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_50,pcVar1,pcVar1 + destination->_M_string_length);
              std::__cxx11::string::append((char *)&local_50);
              Directory::GetFile(&local_80,dindex);
              std::__cxx11::string::append((char *)&local_50);
              SVar4 = CopyADirectory(&local_70,&local_50,SUB41(local_78,0));
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_50._M_dataplus._M_p != &local_50.field_2) {
                operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1
                               );
              }
            }
            else if ((char)local_74 == '\0') {
              CVar8 = CopyFileIfDifferent(&local_70,destination);
              SVar4 = CVar8.super_Status;
            }
            else {
              CVar8 = CopyFileAlways(&local_70,destination);
              SVar4 = CVar8.super_Status;
            }
            uVar7 = (ulong)SVar4 >> 0x20;
            if (SVar4.Kind_ != Success) {
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_70._M_dataplus._M_p != &local_70.field_2) {
                operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1
                               );
              }
              break;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
            }
          }
        }
      }
    }
  }
  else {
    uVar7 = (ulong)SVar4 >> 0x20;
  }
  Directory::~Directory(&local_80);
  return (Status)((ulong)SVar4 & 0xffffffff | uVar7 << 0x20);
}

Assistant:

Status SystemTools::CopyADirectory(std::string const& source,
                                   std::string const& destination, bool always)
{
  Status status;
  Directory dir;
  status = dir.Load(source);
  if (!status.IsSuccess()) {
    return status;
  }
  status = SystemTools::MakeDirectory(destination);
  if (!status.IsSuccess()) {
    return status;
  }

  for (size_t fileNum = 0; fileNum < dir.GetNumberOfFiles(); ++fileNum) {
    if (strcmp(dir.GetFile(static_cast<unsigned long>(fileNum)), ".") != 0 &&
        strcmp(dir.GetFile(static_cast<unsigned long>(fileNum)), "..") != 0) {
      std::string fullPath = source;
      fullPath += "/";
      fullPath += dir.GetFile(static_cast<unsigned long>(fileNum));
      if (SystemTools::FileIsDirectory(fullPath)) {
        std::string fullDestPath = destination;
        fullDestPath += "/";
        fullDestPath += dir.GetFile(static_cast<unsigned long>(fileNum));
        status = SystemTools::CopyADirectory(fullPath, fullDestPath, always);
        if (!status.IsSuccess()) {
          return status;
        }
      } else {
        status = SystemTools::CopyAFile(fullPath, destination, always);
        if (!status.IsSuccess()) {
          return status;
        }
      }
    }
  }

  return status;
}